

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void * xmlHashQLookup3(xmlHashTablePtr table,xmlChar *prefix,xmlChar *name,xmlChar *prefix2,
                      xmlChar *name2,xmlChar *prefix3,xmlChar *name3)

{
  int iVar1;
  unsigned_long uVar2;
  _xmlHashEntry *local_50;
  xmlHashEntryPtr entry;
  unsigned_long key;
  xmlChar *prefix3_local;
  xmlChar *name2_local;
  xmlChar *prefix2_local;
  xmlChar *name_local;
  xmlChar *prefix_local;
  xmlHashTablePtr table_local;
  
  if (((table != (xmlHashTablePtr)0x0) && (name != (xmlChar *)0x0)) &&
     (uVar2 = xmlHashComputeQKey(table,prefix,name,prefix2,name2,prefix3,name3),
     table->table[uVar2].valid != 0)) {
    for (local_50 = table->table + uVar2; local_50 != (_xmlHashEntry *)0x0;
        local_50 = local_50->next) {
      iVar1 = xmlStrQEqual(prefix,name,local_50->name);
      if (((iVar1 != 0) && (iVar1 = xmlStrQEqual(prefix2,name2,local_50->name2), iVar1 != 0)) &&
         (iVar1 = xmlStrQEqual(prefix3,name3,local_50->name3), iVar1 != 0)) {
        return local_50->payload;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void *
xmlHashQLookup3(xmlHashTablePtr table,
                const xmlChar *prefix, const xmlChar *name,
		const xmlChar *prefix2, const xmlChar *name2,
		const xmlChar *prefix3, const xmlChar *name3) {
    unsigned long key;
    xmlHashEntryPtr entry;

    if (table == NULL)
	return(NULL);
    if (name == NULL)
	return(NULL);
    key = xmlHashComputeQKey(table, prefix, name, prefix2,
                             name2, prefix3, name3);
    if (table->table[key].valid == 0)
	return(NULL);
    for (entry = &(table->table[key]); entry != NULL; entry = entry->next) {
	if ((xmlStrQEqual(prefix, name, entry->name)) &&
	    (xmlStrQEqual(prefix2, name2, entry->name2)) &&
	    (xmlStrQEqual(prefix3, name3, entry->name3)))
	    return(entry->payload);
    }
    return(NULL);
}